

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportGlobal
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  Mutability mut;
  undefined1 local_130 [16];
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  ImportType local_d8;
  Type local_90;
  undefined1 local_88 [8];
  GlobalType global_type;
  Location local_68;
  Enum local_44;
  byte local_3d;
  Index local_3c;
  bool mutable__local;
  BinaryReaderInterp *pBStack_38;
  Index import_index_local;
  BinaryReaderInterp *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local._M_len = (size_t)field_name._M_str;
  this_local = (BinaryReaderInterp *)field_name._M_len;
  module_name_local._M_len = (size_t)module_name._M_str;
  field_name_local._M_str = (char *)module_name._M_len;
  local_3d = mutable_;
  local_3c = import_index;
  pBStack_38 = this;
  GetLocation(&local_68,this);
  global_type._16_8_ = type;
  local_44 = (Enum)SharedValidator::OnGlobalImport
                             (&this->validator_,&local_68,type,(bool)(local_3d & 1));
  bVar2 = Failed((Result)local_44);
  if (bVar2) {
    Result::Result((Result *)((long)&module_name_local._M_str + 4),Error);
  }
  else {
    local_90 = type;
    mut = ToMutability((bool)(local_3d & 1));
    GlobalType::GlobalType((GlobalType *)local_88,local_90,mut);
    pMVar1 = this->module_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_f8,
               (basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str,
               &local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_120,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               (allocator<char> *)(local_130 + 0xf));
    GlobalType::Clone((GlobalType *)local_130);
    ImportType::ImportType
              (&local_d8,&local_f8,&local_120,
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)local_130);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::push_back
              (&pMVar1->imports,(value_type *)&local_d8);
    ImportDesc::~ImportDesc((ImportDesc *)&local_d8);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    ~unique_ptr((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                 *)local_130);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)(local_130 + 0xf));
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::push_back
              (&this->global_types_,(value_type *)local_88);
    Result::Result((Result *)((long)&module_name_local._M_str + 4),Ok);
    GlobalType::~GlobalType((GlobalType *)local_88);
  }
  return (Result)module_name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnImportGlobal(Index import_index,
                                          std::string_view module_name,
                                          std::string_view field_name,
                                          Index global_index,
                                          Type type,
                                          bool mutable_) {
  CHECK_RESULT(validator_.OnGlobalImport(GetLocation(), type, mutable_));
  GlobalType global_type{type, ToMutability(mutable_)};
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), global_type.Clone())});
  global_types_.push_back(global_type);
  return Result::Ok;
}